

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String testing::internal::WideStringToUtf8(wchar_t *str,int num_chars)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  int in_EDX;
  size_t extraout_RDX;
  wchar_t *in_RSI;
  char *in_RDI;
  String SVar4;
  stringstream *in_stack_00000008;
  char buffer [32];
  UInt32 unicode_code_point;
  int i;
  stringstream stream;
  char *in_stack_fffffffffffffe28;
  UInt32 in_stack_fffffffffffffe34;
  int local_1a4;
  stringstream local_1a0 [16];
  ostream local_190 [380];
  int local_14;
  wchar_t *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (in_EDX == -1) {
    sVar2 = wcslen(in_RSI);
    local_14 = (int)sVar2;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  for (local_1a4 = 0; (local_1a4 < local_14 && (local_10[local_1a4] != L'\0'));
      local_1a4 = local_1a4 + 1) {
    if ((local_1a4 + 1 < local_14) &&
       (bVar1 = IsUtf16SurrogatePair(local_10[local_1a4],local_10[(long)local_1a4 + 1]), bVar1)) {
      CreateCodePointFromUtf16SurrogatePair(local_10[local_1a4],local_10[(long)local_1a4 + 1]);
      local_1a4 = local_1a4 + 1;
    }
    pcVar3 = CodePointToUtf8(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28);
    std::operator<<(local_190,pcVar3);
  }
  StringStreamToString(in_stack_00000008);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  SVar4.length_ = extraout_RDX;
  SVar4.c_str_ = in_RDI;
  return SVar4;
}

Assistant:

String WideStringToUtf8(const wchar_t* str, int num_chars) {
  if (num_chars == -1)
    num_chars = static_cast<int>(wcslen(str));

  ::std::stringstream stream;
  for (int i = 0; i < num_chars; ++i) {
    UInt32 unicode_code_point;

    if (str[i] == L'\0') {
      break;
    } else if (i + 1 < num_chars && IsUtf16SurrogatePair(str[i], str[i + 1])) {
      unicode_code_point = CreateCodePointFromUtf16SurrogatePair(str[i],
                                                                 str[i + 1]);
      i++;
    } else {
      unicode_code_point = static_cast<UInt32>(str[i]);
    }

    char buffer[32];  // CodePointToUtf8 requires a buffer this big.
    stream << CodePointToUtf8(unicode_code_point, buffer);
  }
  return StringStreamToString(&stream);
}